

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charfreqs.cpp
# Opt level: O2

void exportJSON(FILE *out,long rows,long columns,double *counts,bool do_prot)

{
  undefined8 uVar1;
  bool bVar2;
  char cVar3;
  long lVar4;
  long c;
  long lVar5;
  long lVar6;
  long lVar7;
  
  fputc(0x7b,(FILE *)out);
  if (counts != (double *)0x0) {
    lVar6 = 0;
    lVar7 = 0;
    if (0 < columns) {
      lVar7 = columns;
    }
    if (rows < 1) {
      rows = lVar6;
    }
    lVar4 = 0;
    while (lVar4 != rows) {
      lVar4 = lVar4 + 1;
      bVar2 = true;
      for (lVar5 = 0; lVar7 != lVar5; lVar5 = lVar5 + 1) {
        if (0.0 < counts[lVar5]) {
          if (bVar2) {
            uVar1 = 0x20;
            if (lVar6 != 0) {
              uVar1 = 0x2c;
            }
            cVar3 = unmap_char((uchar)lVar5,do_prot);
            lVar6 = 1;
            fprintf((FILE *)out,"%c\n\t\"%ld\" : {\"%c\" : %g",counts[lVar5],uVar1,lVar4,
                    (ulong)(uint)(int)cVar3);
            bVar2 = false;
          }
          else {
            cVar3 = unmap_char((uchar)lVar5,do_prot);
            fprintf((FILE *)out,", \"%c\" : %g",counts[lVar5],(ulong)(uint)(int)cVar3);
          }
        }
      }
      if (!bVar2) {
        fputc(0x7d,(FILE *)out);
      }
      counts = counts + columns;
    }
  }
  fwrite("\n}\n",3,1,(FILE *)out);
  return;
}

Assistant:

void exportJSON (FILE* out, long rows, long columns, const double* counts, bool do_prot) {
  fprintf (out, "{");
  
  if (counts) {
    bool do_comma = false;
    for (long r = 0; r < rows; r++) {
      bool first = true;
      for (long c = 0; c < columns; c++) {
        if (counts [r*columns + c] > 0.0) {
          if (first) {
            fprintf (out, "%c\n\t\"%ld\" : {\"%c\" : %g", do_comma ? ',' : ' ', r + 1, unmap_char(c,do_prot), counts[r*columns+c]);
            do_comma = true;
            first = false;
          } else {
            fprintf (out, ", \"%c\" : %g", unmap_char(c,do_prot) , counts[r*columns+c]);
          }
        }
      }
      if (!first) {
        fprintf (out, "}");
      }
    }
  }
  
  fprintf (out, "\n}\n");
}